

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O3

void __thiscall
Parser::MapBindIdentifierFromElement<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
          (Parser *this,ParseNodePtr elementNode,anon_class_16_2_de35cfdd handler)

{
  byte bVar1;
  int iVar2;
  Symbol *pSVar3;
  code *pcVar4;
  bool bVar5;
  ParseNodeBin *pPVar6;
  ulong uVar7;
  ParseNodeVar *pPVar8;
  undefined4 *puVar9;
  anon_class_16_2_de35cfdd handler_00;
  
  handler_00.top = handler.top;
  bVar1 = *(byte *)&(this->m_nodeAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.outOfMemoryFunc;
  uVar7 = (ulong)bVar1;
  if (bVar1 == 0x11) {
    pPVar6 = (ParseNodeBin *)ParseNode::AsParseNodeUni((ParseNode *)this);
  }
  else {
    if (bVar1 != 0x31) goto LAB_0082b952;
    pPVar6 = ParseNode::AsParseNodeBin((ParseNode *)this);
  }
  this = (Parser *)pPVar6->pnode1;
  uVar7 = CONCAT71((int7)((ulong)pPVar6 >> 8),
                   *(OpCode *)
                    &(this->m_nodeAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_Allocator.outOfMemoryFunc);
LAB_0082b952:
  handler_00.i = (uint *)(uVar7 & 0xfffffffd);
  if ((char)handler_00.i == 'p') {
    MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
              (this,elementNode,handler_00);
    return;
  }
  if ((byte)((char)uVar7 + 0xafU) < 3) {
    pPVar8 = ParseNode::AsParseNodeVar((ParseNode *)this);
    pSVar3 = pPVar8->sym;
    if (pSVar3->scopeSlot != -1) {
      *(int *)(*(long *)elementNode + 0xb0) = *(int *)(*(long *)elementNode + 0xb0) + 1;
    }
    iVar2 = *(int *)handler_00.top;
    pSVar3->scopeSlot = iVar2;
    *(int *)handler_00.top = iVar2 + 1;
  }
  else if ((char)uVar7 != '\v') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }